

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O0

void __thiscall MPEGPictureHeader::buildHeader(MPEGPictureHeader *this)

{
  uint uVar1;
  undefined1 local_30 [4];
  int bitCnt;
  BitStreamWriter bitWriter;
  MPEGPictureHeader *this_local;
  
  bitWriter._24_8_ = this;
  BitStreamWriter::BitStreamWriter((BitStreamWriter *)local_30);
  BitStreamWriter::setBuffer
            ((BitStreamWriter *)local_30,(this->super_MPEGRawDataHeader).m_data_buffer,
             (this->super_MPEGRawDataHeader).m_data_buffer +
             (this->super_MPEGRawDataHeader).m_max_data_len);
  BitStreamWriter::putBits((BitStreamWriter *)local_30,0x10,0);
  BitStreamWriter::putBits((BitStreamWriter *)local_30,0x10,0x100);
  BitStreamWriter::putBits
            ((BitStreamWriter *)local_30,10,
             (uint)*(ushort *)&(this->super_MPEGRawDataHeader).field_0x1c);
  BitStreamWriter::putBits((BitStreamWriter *)local_30,3,this->pict_type);
  BitStreamWriter::putBits((BitStreamWriter *)local_30,0x10,(uint)this->vbv_delay);
  if ((this->pict_type == P_FRAME) || (this->pict_type == B_FRAME)) {
    BitStreamWriter::putBits((BitStreamWriter *)local_30,1,this->full_pel[0]);
    BitStreamWriter::putBits((BitStreamWriter *)local_30,3,(uint)this->mpeg_f_code[0][0]);
  }
  if (this->pict_type == B_FRAME) {
    BitStreamWriter::putBits((BitStreamWriter *)local_30,1,this->full_pel[1]);
    BitStreamWriter::putBits((BitStreamWriter *)local_30,3,(uint)this->mpeg_f_code[1][0]);
  }
  BitStreamWriter::flushBits((BitStreamWriter *)local_30);
  uVar1 = BitStreamWriter::getBitsCount((BitStreamWriter *)local_30);
  (this->super_MPEGRawDataHeader).m_data_buffer_len = ((int)uVar1 >> 3) + (uint)((uVar1 & 7) != 0);
  return;
}

Assistant:

void MPEGPictureHeader::buildHeader()
{
    BitStreamWriter bitWriter{};
    bitWriter.setBuffer(m_data_buffer, m_data_buffer + m_max_data_len);

    bitWriter.putBits(16, 0);
    bitWriter.putBits(16, PICTURE_START_CODE);

    bitWriter.putBits(10, ref);
    bitWriter.putBits(3, static_cast<int>(pict_type));
    bitWriter.putBits(16, vbv_delay);

    if (pict_type == PictureCodingType::P_FRAME || pict_type == PictureCodingType::B_FRAME)
    {
        bitWriter.putBits(1, full_pel[0]);
        bitWriter.putBits(3, mpeg_f_code[0][0]);
    }
    if (pict_type == PictureCodingType::B_FRAME)
    {
        bitWriter.putBits(1, full_pel[1]);
        bitWriter.putBits(3, mpeg_f_code[1][0]);
    }
    bitWriter.flushBits();
    const int bitCnt = bitWriter.getBitsCount();
    m_data_buffer_len = (bitCnt >> 3) + (bitCnt & 7 ? 1 : 0);
}